

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O2

void __thiscall diffusion::ShmWriter::cyclic_write(ShmWriter *this,char *data,size_t size)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint32_t uVar4;
  
  sVar3 = size;
  while (iVar2 = (int)sVar3, 0 < iVar2) {
    iVar1 = this->shm_body_size_ - this->writer_shm_body_offset_;
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    memcpy(this->shm_body_position_ + (int)this->writer_shm_body_offset_,
           data + (size - (sVar3 & 0xffffffff)),(long)iVar1);
    sVar3 = (size_t)(uint)(iVar2 - iVar1);
    uVar4 = iVar1 + this->writer_shm_body_offset_;
    if (uVar4 == this->shm_body_size_) {
      uVar4 = 0;
    }
    this->writer_shm_body_offset_ = uVar4;
  }
  return;
}

Assistant:

void ShmWriter::cyclic_write(char const *data, std::size_t size) {
    auto bytes_left = static_cast<Size>(size);
    while (bytes_left > 0) {
        auto start_position_unwritten_bytes = data + size - bytes_left;
        auto space_left = shm_body_size_ - static_cast<Size>(writer_shm_body_offset_);
        auto bytes_can_be_written_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(shm_body_position_ + static_cast<Offset>(writer_shm_body_offset_), start_position_unwritten_bytes, bytes_can_be_written_without_wrap);
        writer_shm_body_offset_ += bytes_can_be_written_without_wrap;
        bytes_left -= bytes_can_be_written_without_wrap;
        if (static_cast<Size>(writer_shm_body_offset_) == shm_body_size_) {
            writer_shm_body_offset_ = 0;
        }
    }
}